

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

TryEmplaceResult * __thiscall
QHash<std::pair<QFontEngine*,int>,QGlyphRun>::tryEmplace_impl<std::pair<QFontEngine*,int>const&>
          (TryEmplaceResult *__return_storage_ptr__,void *this,pair<QFontEngine_*,_int> *key)

{
  uchar uVar1;
  uint *puVar2;
  Span *pSVar3;
  Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_> *pDVar4;
  QHashMultiReturnType<QFontEngine_*,_int> hash;
  Node<std::pair<QFontEngine_*,_int>,_QGlyphRun> *pNVar6;
  long in_FS_OFFSET;
  bool bVar8;
  Bucket BVar9;
  QHash<std::pair<QFontEngine_*,_int>,_QGlyphRun> local_40;
  long local_38;
  Span *pSVar5;
  ulong uVar7;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*this == 0) {
    pDVar4 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_>::
             detached((Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_> *)0x0);
    *(Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_> **)this = pDVar4;
  }
  local_40.d = (Data *)0x0;
  hash = qHashMulti<QFontEngine*,int>(*(size_t *)(*this + 0x18),&key->first,&key->second);
  BVar9 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QFontEngine*,int>,QGlyphRun>>::
          findBucketWithHash<std::pair<QFontEngine*,int>>(*this,key,hash);
  uVar7 = BVar9.index;
  pSVar5 = BVar9.span;
  uVar1 = pSVar5->offsets[uVar7];
  puVar2 = *this;
  if ((puVar2 == (uint *)0x0) || (1 < *puVar2)) {
LAB_00531e08:
    QHash<std::pair<QFontEngine_*,_int>,_QGlyphRun>::operator=
              (&local_40,(QHash<std::pair<QFontEngine_*,_int>,_QGlyphRun> *)this);
    if (uVar1 == 0xff) {
      bVar8 = *(ulong *)(*this + 0x10) >> 1 <= *(ulong *)(*this + 8);
    }
    else {
      bVar8 = false;
    }
    pDVar4 = *this;
    pSVar3 = pDVar4->spans;
    if (bVar8) {
      pDVar4 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_>::
               detached(pDVar4,pDVar4->size + 1);
    }
    else {
      pDVar4 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_>::
               detached(pDVar4);
    }
    *(Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_> **)this = pDVar4;
    if (bVar8) {
      BVar9 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QFontEngine*,int>,QGlyphRun>>::
              findBucketWithHash<std::pair<QFontEngine*,int>>
                        ((Data<QHashPrivate::Node<std::pair<QFontEngine*,int>,QGlyphRun>> *)pDVar4,
                         key,hash);
    }
    else {
      BVar9.index._0_4_ = (uint)BVar9.index & 0x7f;
      BVar9.span = pDVar4->spans +
                   ((((ulong)((long)pSVar5 - (long)pSVar3) >> 4) * 0x1c71c71c71c71c80 | uVar7) >> 7)
      ;
      BVar9.index._4_4_ = 0;
    }
  }
  else {
    if (uVar1 != 0xff) goto LAB_00531eed;
    if (*(ulong *)(puVar2 + 4) >> 1 <= *(ulong *)(puVar2 + 2)) goto LAB_00531e08;
  }
  if (uVar1 == 0xff) {
    pNVar6 = QHashPrivate::Span<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_>::
             insert(BVar9.span,BVar9.index);
    (pNVar6->key).first = key->first;
    (pNVar6->key).second = key->second;
    QGlyphRun::QGlyphRun(&pNVar6->value);
    *(long *)(*this + 8) = *(long *)(*this + 8) + 1;
  }
LAB_00531eed:
  pSVar5 = (*this)->spans;
  (__return_storage_ptr__->iterator).i.d = *this;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)BVar9.span - (long)pSVar5) >> 4) * 0x1c71c71c71c71c80 | BVar9.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<std::pair<QFontEngine_*,_int>,_QGlyphRun>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }